

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_utils.hpp
# Opt level: O3

void duckdb::ParquetDecodeUtils::SkipAligned(ByteBuffer *src,idx_t count,bitpacking_width_t width)

{
  ulong req_len;
  InvalidInputException *this;
  string local_40;
  
  CheckWidth(width);
  if ((count & 0x1f) == 0) {
    req_len = (width * count) / 8;
    ByteBuffer::available(src,req_len);
    src->len = src->len - req_len;
    src->ptr = src->ptr + req_len;
    return;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Aligned bitpacking count must be a multiple of %llu","");
  InvalidInputException::InvalidInputException<unsigned_long>(this,&local_40,0x20);
  __cxa_throw(this,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void SkipAligned(ByteBuffer &src, const idx_t count, const bitpacking_width_t width) {
		CheckWidth(width);
		if (count % BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE != 0) {
			throw InvalidInputException("Aligned bitpacking count must be a multiple of %llu",
			                            BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE);
		}
		const auto read_size = count * width / BITPACK_DLEN;
		src.inc(read_size);
	}